

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag>::
crossover(storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag> *this,
         local_context *ctx,bit_array *x)

{
  baryonyx *pbVar1;
  undefined8 uVar2;
  result_type_conflict2 rVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  double *in_stack_fffffffffffffe88;
  vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
  *this_00;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  int local_70;
  value_type local_6c;
  int second;
  int first_1;
  char *local_60;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  bernoulli_distribution local_48;
  bernoulli_distribution b;
  int first;
  undefined1 local_30 [8];
  m_indices_reader lock;
  bit_array *x_local;
  local_context *ctx_local;
  storage<baryonyx::itm::quadratic_cost_type<double>,_baryonyx::itm::minimize_tag> *this_local;
  
  lock._8_8_ = x;
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)local_30,&this->m_indices_mutex);
  rVar3 = std::bernoulli_distribution::operator()(&ctx->crossover_bastert_insertion,&ctx->rng);
  if (rVar3) {
    iVar4 = choose_a_solution(this,ctx);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_indices,(long)iVar4);
    b._M_param._M_p._0_4_ = *pvVar5;
    std::bernoulli_distribution::bernoulli_distribution(&local_48,0.5);
    rVar3 = std::bernoulli_distribution::operator()(&local_48,&ctx->rng);
    if (rVar3) {
      rVar3 = std::bernoulli_distribution::operator()(&local_48,&ctx->rng);
      uVar2 = lock._8_8_;
      if (rVar3) {
        pvVar6 = std::
                 vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                 ::operator[](&this->m_data,(long)b._M_param._M_p._0_4_);
        crossover(this,ctx,(bit_array *)uVar2,&pvVar6->x,&this->m_bastert);
        pbVar1 = _stdout;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_58,"- crossover between {} ({}) and bastert\n");
        pvVar6 = std::
                 vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                 ::operator[](&this->m_data,(long)b._M_param._M_p._0_4_);
        fmt._M_str = (char *)&b;
        fmt._M_len = (size_t)local_58._M_str;
        to_log<int,double>(pbVar1,(FILE *)0x7,(uint)local_58._M_len,fmt,(int *)&pvVar6->value,
                           in_stack_fffffffffffffe88);
      }
      else {
        pvVar6 = std::
                 vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                 ::operator[](&this->m_data,(long)b._M_param._M_p._0_4_);
        bit_array::operator=(&pvVar6->x,&this->m_bastert);
      }
    }
    else {
      iVar4 = bit_array_impl::size((bit_array_impl *)lock._8_8_);
      init_with_random(&this->m_random,&ctx->rng,iVar4,0.5);
      rVar3 = std::bernoulli_distribution::operator()(&local_48,&ctx->rng);
      uVar2 = lock._8_8_;
      if (rVar3) {
        pvVar6 = std::
                 vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                 ::operator[](&this->m_data,(long)b._M_param._M_p._0_4_);
        crossover(this,ctx,(bit_array *)uVar2,&pvVar6->x,&this->m_random);
        pbVar1 = _stdout;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&second,
                   "- crossover between {} ({}) and random\n");
        pvVar6 = std::
                 vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                 ::operator[](&this->m_data,(long)b._M_param._M_p._0_4_);
        fmt_00._M_str = (char *)&b;
        fmt_00._M_len = (size_t)local_60;
        to_log<int,double>(pbVar1,(FILE *)0x7,second,fmt_00,(int *)&pvVar6->value,
                           in_stack_fffffffffffffe88);
      }
      else {
        pvVar6 = std::
                 vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                 ::operator[](&this->m_data,(long)b._M_param._M_p._0_4_);
        bit_array::operator=(&pvVar6->x,&this->m_random);
      }
    }
  }
  else {
    iVar4 = choose_a_solution(this,ctx);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_indices,(long)iVar4);
    local_6c = *pvVar5;
    iVar4 = choose_a_solution(this,ctx);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_indices,(long)iVar4);
    local_70 = *pvVar5;
    while (uVar2 = lock._8_8_, local_6c == local_70) {
      iVar4 = choose_a_solution(this,ctx);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_indices,(long)iVar4);
      local_70 = *pvVar5;
    }
    pvVar6 = std::
             vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ::operator[](&this->m_data,(long)local_6c);
    pvVar7 = std::
             vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ::operator[](&this->m_data,(long)local_70);
    crossover(this,ctx,(bit_array *)uVar2,&pvVar6->x,&pvVar7->x);
    pbVar1 = _stdout;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_80,"- crossover between {} ({}) and {} ({})\n");
    this_00 = &this->m_data;
    pvVar6 = std::
             vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ::operator[](this_00,(long)local_6c);
    pvVar7 = std::
             vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
             ::operator[](this_00,(long)local_70);
    fmt_01._M_str = (char *)&local_6c;
    fmt_01._M_len = (size_t)local_80._M_str;
    to_log<int,double,int,double>
              (pbVar1,(FILE *)0x7,(uint)local_80._M_len,fmt_01,(int *)&pvVar6->value,
               (double *)&local_70,(int *)&pvVar7->value,(double *)this_00);
  }
  std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)local_30);
  return;
}

Assistant:

void crossover(local_context& ctx, bit_array& x)
    {
        m_indices_reader lock(m_indices_mutex);

        if (ctx.crossover_bastert_insertion(ctx.rng)) {
            int first = m_indices[choose_a_solution(ctx)];
            std::bernoulli_distribution b(0.5);

            if (b(ctx.rng)) {
                if (b(ctx.rng)) {
                    crossover(ctx, x, m_data[first].x, m_bastert);
                    to_log(stdout,
                           7u,
                           "- crossover between {} ({}) and bastert\n",
                           first,
                           m_data[first].value);
                } else {
                    m_data[first].x = m_bastert;
                }
            } else {
                init_with_random(m_random, ctx.rng, x.size(), 0.5);
                if (b(ctx.rng)) {
                    crossover(ctx, x, m_data[first].x, m_random);
                    to_log(stdout,
                           7u,
                           "- crossover between {} ({}) and random\n",
                           first,
                           m_data[first].value);
                } else {
                    m_data[first].x = m_random;
                }
            }
        } else {
            int first = m_indices[choose_a_solution(ctx)];
            int second = m_indices[choose_a_solution(ctx)];
            while (first == second)
                second = m_indices[choose_a_solution(ctx)];

            crossover(ctx, x, m_data[first].x, m_data[second].x);

            to_log(stdout,
                   7u,
                   "- crossover between {} ({}) and {} ({})\n",
                   first,
                   m_data[first].value,
                   second,
                   m_data[second].value);
        }
    }